

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O2

int get_array_options_inner
              (char *json_string,char *option_name,size_t *count,char ***string_array,
              int **int_array,int is_string_array)

{
  json_t *json;
  json_t *json_00;
  size_t sVar1;
  char **__ptr;
  int *piVar2;
  json_t *json_01;
  char *pcVar3;
  longlong lVar4;
  int iVar5;
  ulong index;
  
  json = get_root_option_json_object(json_string);
  iVar5 = -1;
  if (json != (json_t *)0x0) {
    piVar2 = (int *)option_name;
    json_00 = json_object_get(json,option_name);
    if (json_00 == (json_t *)0x0) {
      json_decref(json);
      iVar5 = 0;
    }
    else {
      if (json_00->type == JSON_ARRAY) {
        sVar1 = json_array_size(json_00);
        *count = sVar1;
        if (is_string_array == 0) {
          piVar2 = (int *)malloc(sVar1 * 4);
          __ptr = (char **)option_name;
        }
        else {
          __ptr = (char **)malloc(sVar1 * 8);
        }
        if ((is_string_array == 0 || __ptr != (char **)0x0) &&
           (is_string_array != 0 || piVar2 != (int *)0x0)) {
          index = 0;
          do {
            if (sVar1 <= index) {
              if (is_string_array == 0) {
                *int_array = piVar2;
              }
              else {
                *string_array = __ptr;
              }
              json_decref(json);
              return 1;
            }
            json_01 = json_array_get(json_00,index);
            if (is_string_array == 0) {
              if ((json_01 == (json_t *)0x0) || (json_01->type != JSON_INTEGER)) {
                pcVar3 = "integer";
                goto LAB_00105550;
              }
              lVar4 = json_integer_value(json_01);
              piVar2[index] = (int)lVar4;
            }
            else {
              if ((json_01 == (json_t *)0x0) || (json_01->type != JSON_STRING)) {
                pcVar3 = "string";
LAB_00105550:
                fprintf(_stderr,"error: option %zu in array %s is expected to be a %s\n",index,
                        option_name,pcVar3);
                json_decref(json);
                free(__ptr);
                return -1;
              }
              pcVar3 = json_string_value(json_01);
              pcVar3 = strdup(pcVar3);
              __ptr[index] = pcVar3;
            }
            index = index + 1;
            sVar1 = *count;
          } while( true );
        }
        fprintf(_stderr,"error: couldn\'t allocate array for option %s (%zu items)\n",option_name,
                sVar1);
      }
      else {
        fprintf(_stderr,"error: option item %s is expected to be a array\n",option_name);
      }
      json_decref(json);
    }
  }
  return iVar5;
}

Assistant:

static int get_array_options_inner(const char * json_string, const char * option_name, size_t * count, char *** string_array, int ** int_array, int is_string_array)
{
	json_t * root, *option_array, *option_item;
	char ** option_strings;
	int * option_ints;
	size_t i;

	root = get_root_option_json_object(json_string);
	if (!root)
		return -1;

	option_array = json_object_get(root, option_name);
	if (!option_array)
	{
		json_decref(root);
		return 0;
	}

	if (!json_is_array(option_array))
	{
		fprintf(stderr, "error: option item %s is expected to be a array\n", option_name);
		json_decref(root);
		return -1;
	}

	*count = json_array_size(option_array);
	if(is_string_array)
		option_strings = malloc(*count * sizeof(char *));
	else
		option_ints = malloc(*count * sizeof(int));
	if ((is_string_array && !option_strings) || (!is_string_array && !option_ints))
	{
		fprintf(stderr, "error: couldn't allocate array for option %s (%zu items)\n", option_name, *count);
		json_decref(root);
		return -1;
	}
	for (i = 0; i < *count; i++)
	{
		option_item = json_array_get(option_array, i);
		if ((is_string_array && !json_is_string(option_item)) || (!is_string_array && !json_is_integer(option_item)))
		{
			fprintf(stderr, "error: option %zu in array %s is expected to be a %s\n", i, option_name, is_string_array ? "string" : "integer");
			json_decref(root);
			free(option_strings);
			return -1;
		}
		if(is_string_array)
			option_strings[i] = strdup(json_string_value(option_item));
		else
			option_ints[i] = json_integer_value(option_item);
	}

	if (is_string_array)
		*string_array = option_strings;
	else
		*int_array = option_ints;

	json_decref(root);
	return 1;
}